

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,ExpressionList *expression_list)

{
  bool bVar1;
  ostream *this_00;
  reference ppEVar2;
  Expression *expression;
  iterator __end1;
  iterator __begin1;
  vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_> *__range1;
  ExpressionList *expression_list_local;
  PrintVisitor *this_local;
  
  PrintTabs(this);
  this_00 = std::operator<<((ostream *)&this->stream_,"ExpressionList: ");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this->num_tabs_ = this->num_tabs_ + 1;
  __end1 = std::vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>::begin
                     (&expression_list->expressions_);
  expression = (Expression *)
               std::vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>::end
                         (&expression_list->expressions_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<IRT::Expression_**,_std::vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>_>
                                *)&expression);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<IRT::Expression_**,_std::vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>_>
              ::operator*(&__end1);
    (*((*ppEVar2)->super_BaseElement)._vptr_BaseElement[2])(*ppEVar2,this);
    __gnu_cxx::
    __normal_iterator<IRT::Expression_**,_std::vector<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>_>
    ::operator++(&__end1);
  }
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(ExpressionList *expression_list) {
  PrintTabs();
  stream_ << "ExpressionList: " << std::endl;
  ++num_tabs_;
  for (auto expression: expression_list->expressions_) {
    expression->Accept(this);
  }
  --num_tabs_;
}